

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_summon.cpp
# Opt level: O0

int AF_A_Summon(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  uint uVar1;
  AActor *pAVar2;
  AInventory *this;
  AActor *pAVar3;
  bool bVar4;
  bool local_ca;
  bool local_c7;
  FSoundID local_c4;
  DVector3 local_c0;
  FName local_a4;
  AInventory *local_a0;
  AInventory *power;
  DVector3 local_90;
  AArtiDarkServant *local_78;
  AActor *arti;
  AActor *local_58;
  AMinotaurFriend *mo;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_20;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_20 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_summon.cpp"
                  ,0x34,"int AF_A_Summon(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar4) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_c7 = true;
    if (stateowner != (AActor *)0x0) {
      local_c7 = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_c7 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_summon.cpp"
                    ,0x34,"int AF_A_Summon(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar4 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar4 = true, pVStack_20[(int)self].field_0.field_1.atag != 1)) {
        bVar4 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar4) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_summon.cpp"
                      ,0x34,"int AF_A_Summon(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      stateinfo = (FStateParamInfo *)pVStack_20[(int)self].field_0.field_1.a;
      local_ca = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_ca = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_ca == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_summon.cpp"
                      ,0x34,"int AF_A_Summon(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar4 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar4 = true, pVStack_20[(int)self].field_0.field_1.atag != 8)) {
        bVar4 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar4) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_summon.cpp"
                      ,0x34,"int AF_A_Summon(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      mo = (AMinotaurFriend *)pVStack_20[(int)self].field_0.field_1.a;
    }
    else {
      mo = (AMinotaurFriend *)0x0;
    }
    AActor::Pos((DVector3 *)&arti,stateowner);
    local_58 = (AActor *)Spawn<AMinotaurFriend>((DVector3 *)&arti,ALLOW_REPLACE);
    if (local_58 != (AActor *)0x0) {
      bVar4 = P_TestMobjLocation(local_58);
      if ((bVar4) &&
         (pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&stateowner->tracer),
         pAVar2 != (AActor *)0x0)) {
        *(int *)&local_58->field_0x49c = level.maptime;
        pAVar2 = TObjPtr<AActor>::operator->(&stateowner->tracer);
        TFlags<ActorFlag,_unsigned_int>::operator&
                  ((TFlags<ActorFlag,_unsigned_int> *)((long)&power + 4),
                   (int)pAVar2 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
        uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&power + 4));
        if (uVar1 == 0) {
          (local_58->tracer).field_0 = (stateowner->tracer).field_0;
          this = (AInventory *)Spawn<APowerMinotaur>();
          local_a0 = this;
          pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&stateowner->tracer);
          AInventory::CallTryPickup(this,pAVar2,(AActor **)0x0);
          pAVar2 = local_58;
          pAVar3 = TObjPtr<AActor>::operator->(&stateowner->tracer);
          AActor::SetFriendPlayer(pAVar2,pAVar3->player);
        }
        else {
          TObjPtr<AActor>::operator=(&local_58->tracer,(AActor *)0x0);
        }
        FName::FName(&local_a4,"MinotaurSmoke");
        AActor::Pos(&local_c0,stateowner);
        Spawn(&local_a4,&local_c0,ALLOW_REPLACE);
        pAVar2 = stateowner;
        FSoundID::FSoundID(&local_c4,&(local_58->ActiveSound).super_FSoundID);
        S_Sound(pAVar2,2,&local_c4,1.0,1.0);
      }
      else {
        (*(local_58->super_DThinker).super_DObject._vptr_DObject[4])();
        AActor::Pos(&local_90,stateowner);
        local_78 = Spawn<AArtiDarkServant>(&local_90,ALLOW_REPLACE);
        if (local_78 != (AArtiDarkServant *)0x0) {
          TFlags<ActorFlag,_unsigned_int>::operator|=
                    (&(local_78->super_AInventory).super_AActor.flags,MF_DROPPED);
        }
      }
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_summon.cpp"
                ,0x34,"int AF_A_Summon(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Summon)
{
	PARAM_ACTION_PROLOGUE;

	AMinotaurFriend *mo;

	mo = Spawn<AMinotaurFriend>(self->Pos(), ALLOW_REPLACE);
	if (mo)
	{
		if (P_TestMobjLocation(mo) == false || !self->tracer)
		{ // Didn't fit - change back to artifact
			mo->Destroy();
			AActor *arti = Spawn<AArtiDarkServant>(self->Pos(), ALLOW_REPLACE);
			if (arti) arti->flags |= MF_DROPPED;
			return 0;
		}

		mo->StartTime = level.maptime;
		if (self->tracer->flags & MF_CORPSE)
		{	// Master dead
			mo->tracer = NULL;		// No master
		}
		else
		{
			mo->tracer = self->tracer;		// Pointer to master
			AInventory *power = Spawn<APowerMinotaur>();
			power->CallTryPickup(self->tracer);
			mo->SetFriendPlayer(self->tracer->player);
		}

		// Make smoke puff
		Spawn("MinotaurSmoke", self->Pos(), ALLOW_REPLACE);
		S_Sound(self, CHAN_VOICE, mo->ActiveSound, 1, ATTN_NORM);
	}
	return 0;
}